

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O3

base_uint<256U> * __thiscall base_uint<256U>::operator<<=(base_uint<256U> *this,uint shift)

{
  ulong uVar1;
  sbyte sVar2;
  long lVar3;
  uint uVar4;
  long in_FS_OFFSET;
  base_uint<256U> a;
  base_uint<256U> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&local_38,this);
  this->pn[4] = 0;
  this->pn[5] = 0;
  this->pn[6] = 0;
  this->pn[7] = 0;
  this->pn[0] = 0;
  this->pn[1] = 0;
  this->pn[2] = 0;
  this->pn[3] = 0;
  uVar1 = (ulong)(shift >> 5);
  sVar2 = (sbyte)(shift & 0x1f);
  lVar3 = 0;
  do {
    if (uVar1 + lVar3 < 7 && (shift & 0x1f) != 0) {
      uVar4 = local_38.pn[lVar3];
      this->pn[uVar1 + lVar3 + 1] = this->pn[uVar1 + lVar3 + 1] | uVar4 >> (0x20U - sVar2 & 0x1f);
LAB_0081ecac:
      this->pn[uVar1 + lVar3] = this->pn[uVar1 + lVar3] | uVar4 << sVar2;
    }
    else if (uVar1 + lVar3 < 8) {
      uVar4 = local_38.pn[lVar3];
      goto LAB_0081ecac;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return this;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator<<=(unsigned int shift)
{
    base_uint<BITS> a(*this);
    for (int i = 0; i < WIDTH; i++)
        pn[i] = 0;
    int k = shift / 32;
    shift = shift % 32;
    for (int i = 0; i < WIDTH; i++) {
        if (i + k + 1 < WIDTH && shift != 0)
            pn[i + k + 1] |= (a.pn[i] >> (32 - shift));
        if (i + k < WIDTH)
            pn[i + k] |= (a.pn[i] << shift);
    }
    return *this;
}